

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

int nextScaffoldPart(XML_Parser parser)

{
  uint uVar1;
  int iVar2;
  DTD *pDVar3;
  CONTENT_SCAFFOLD *pCVar4;
  CONTENT_SCAFFOLD *pCVar5;
  int *piVar6;
  CONTENT_SCAFFOLD *parent;
  CONTENT_SCAFFOLD *temp;
  int next;
  CONTENT_SCAFFOLD *me;
  DTD *dtd;
  XML_Parser parser_local;
  
  pDVar3 = parser->m_dtd;
  if (pDVar3->scaffIndex == (int *)0x0) {
    piVar6 = (int *)(*(parser->m_mem).malloc_fcn)((ulong)parser->m_groupSize << 2);
    pDVar3->scaffIndex = piVar6;
    if (pDVar3->scaffIndex == (int *)0x0) {
      return -1;
    }
    *pDVar3->scaffIndex = 0;
  }
  if (pDVar3->scaffSize <= pDVar3->scaffCount) {
    if (pDVar3->scaffold == (CONTENT_SCAFFOLD *)0x0) {
      parent = (CONTENT_SCAFFOLD *)(*(parser->m_mem).malloc_fcn)(0x400);
      if (parent == (CONTENT_SCAFFOLD *)0x0) {
        return -1;
      }
      pDVar3->scaffSize = 0x20;
    }
    else {
      parent = (CONTENT_SCAFFOLD *)
               (*(parser->m_mem).realloc_fcn)(pDVar3->scaffold,(ulong)(pDVar3->scaffSize << 1) << 5)
      ;
      if (parent == (CONTENT_SCAFFOLD *)0x0) {
        return -1;
      }
      pDVar3->scaffSize = pDVar3->scaffSize << 1;
    }
    pDVar3->scaffold = parent;
  }
  uVar1 = pDVar3->scaffCount;
  pDVar3->scaffCount = uVar1 + 1;
  pCVar4 = pDVar3->scaffold;
  if (pDVar3->scaffLevel != 0) {
    pCVar5 = pDVar3->scaffold;
    iVar2 = pDVar3->scaffIndex[pDVar3->scaffLevel + -1];
    if (pCVar5[iVar2].lastchild != 0) {
      pDVar3->scaffold[pCVar5[iVar2].lastchild].nextsib = uVar1;
    }
    if (pCVar5[iVar2].childcnt == 0) {
      pCVar5[iVar2].firstchild = uVar1;
    }
    pCVar5[iVar2].lastchild = uVar1;
    pCVar5[iVar2].childcnt = pCVar5[iVar2].childcnt + 1;
  }
  pCVar4[(int)uVar1].nextsib = 0;
  pCVar4[(int)uVar1].childcnt = 0;
  pCVar4[(int)uVar1].lastchild = 0;
  pCVar4[(int)uVar1].firstchild = 0;
  return uVar1;
}

Assistant:

static int FASTCALL
nextScaffoldPart(XML_Parser parser)
{
  DTD * const dtd = parser->m_dtd;  /* save one level of indirection */
  CONTENT_SCAFFOLD * me;
  int next;

  if (!dtd->scaffIndex) {
    dtd->scaffIndex = (int *)MALLOC(parser, parser->m_groupSize * sizeof(int));
    if (!dtd->scaffIndex)
      return -1;
    dtd->scaffIndex[0] = 0;
  }

  if (dtd->scaffCount >= dtd->scaffSize) {
    CONTENT_SCAFFOLD *temp;
    if (dtd->scaffold) {
      temp = (CONTENT_SCAFFOLD *)
        REALLOC(parser, dtd->scaffold, dtd->scaffSize * 2 * sizeof(CONTENT_SCAFFOLD));
      if (temp == NULL)
        return -1;
      dtd->scaffSize *= 2;
    }
    else {
      temp = (CONTENT_SCAFFOLD *)MALLOC(parser, INIT_SCAFFOLD_ELEMENTS
                                        * sizeof(CONTENT_SCAFFOLD));
      if (temp == NULL)
        return -1;
      dtd->scaffSize = INIT_SCAFFOLD_ELEMENTS;
    }
    dtd->scaffold = temp;
  }
  next = dtd->scaffCount++;
  me = &dtd->scaffold[next];
  if (dtd->scaffLevel) {
    CONTENT_SCAFFOLD *parent = &dtd->scaffold[dtd->scaffIndex[dtd->scaffLevel-1]];
    if (parent->lastchild) {
      dtd->scaffold[parent->lastchild].nextsib = next;
    }
    if (!parent->childcnt)
      parent->firstchild = next;
    parent->lastchild = next;
    parent->childcnt++;
  }
  me->firstchild = me->lastchild = me->childcnt = me->nextsib = 0;
  return next;
}